

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O0

bool __thiscall SuperCardPro::ReadExact(SuperCardPro *this,void *buf,int len)

{
  uint uVar1;
  int local_34;
  void *pvStack_30;
  int bytes_read;
  uint8_t *p;
  void *pvStack_20;
  int len_local;
  void *buf_local;
  SuperCardPro *this_local;
  
  local_34 = 0;
  pvStack_30 = buf;
  p._4_4_ = len;
  pvStack_20 = buf;
  buf_local = this;
  while( true ) {
    if ((int)p._4_4_ < 1) {
      return true;
    }
    uVar1 = (*this->_vptr_SuperCardPro[2])(this,pvStack_30,(ulong)p._4_4_,&local_34);
    if ((uVar1 & 1) == 0) break;
    pvStack_30 = (void *)((long)pvStack_30 + (long)local_34);
    p._4_4_ = p._4_4_ - local_34;
  }
  return false;
}

Assistant:

bool SuperCardPro::ReadExact(void* buf, int len)
{
    uint8_t* p = reinterpret_cast<uint8_t*>(buf);
    auto bytes_read = 0;

    while (len > 0)
    {
        if (!Read(p, len, &bytes_read))
            return false;

        p += bytes_read;
        len -= bytes_read;
    }
    return true;
}